

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

void freeProof2(proof2_t *proof)

{
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    free((void *)*in_RDI);
    free((void *)in_RDI[3]);
    free((void *)in_RDI[4]);
    free((void *)in_RDI[2]);
    free((void *)in_RDI[5]);
  }
  return;
}

Assistant:

static void freeProof2(proof2_t* proof) {
  if (proof) {
    free(proof->seedInfo);
    free(proof->C);
    free(proof->input);
    free(proof->aux);
    free(proof->msgs);
  }
}